

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O1

bool __thiscall
llvm::DWARFDebugLine::LineTable::getFileLineInfoForAddress
          (LineTable *this,SectionedAddress Address,char *CompDir,FileLineInfoKind Kind,
          DILineInfo *Result)

{
  ushort uVar1;
  pointer pRVar2;
  DILineInfo *pDVar3;
  bool bVar4;
  uint32_t uVar5;
  size_t sVar6;
  StringRef CompDir_00;
  anon_union_16_2_fc7899a5_for_OptionalStorage<llvm::StringRef,_true>_2 local_58;
  undefined8 local_48;
  DILineInfo *local_40;
  FileLineInfoKind local_34;
  
  uVar5 = lookupAddress(this,Address);
  if (uVar5 == 0xffffffff) {
    bVar4 = false;
  }
  else {
    pRVar2 = (this->Rows).
             super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar1 = pRVar2[uVar5].File;
    local_40 = Result;
    local_34 = Kind;
    if (CompDir == (char *)0x0) {
      sVar6 = 0;
    }
    else {
      sVar6 = strlen(CompDir);
    }
    pDVar3 = local_40;
    CompDir_00.Length = sVar6;
    CompDir_00.Data = CompDir;
    bVar4 = Prologue::getFileNameByIndex
                      (&this->Prologue,(ulong)uVar1,CompDir_00,local_34,&local_40->FileName,native);
    if (bVar4) {
      pDVar3->Line = pRVar2[uVar5].Line;
      pDVar3->Column = (uint)pRVar2[uVar5].Column;
      pDVar3->Discriminator = pRVar2[uVar5].Discriminator;
      getSourceByIndex((Optional<llvm::StringRef> *)&local_58.value,this,(ulong)pRVar2[uVar5].File,
                       local_34);
      *(undefined8 *)&(pDVar3->Source).Storage.hasVal = local_48;
      (pDVar3->Source).Storage.field_0.value.Data = local_58.value.Data;
      (pDVar3->Source).Storage.field_0.value.Length = local_58.value.Length;
    }
  }
  return bVar4;
}

Assistant:

bool DWARFDebugLine::LineTable::getFileLineInfoForAddress(
    object::SectionedAddress Address, const char *CompDir,
    FileLineInfoKind Kind, DILineInfo &Result) const {
  // Get the index of row we're looking for in the line table.
  uint32_t RowIndex = lookupAddress(Address);
  if (RowIndex == -1U)
    return false;
  // Take file number and line/column from the row.
  const auto &Row = Rows[RowIndex];
  if (!getFileNameByIndex(Row.File, CompDir, Kind, Result.FileName))
    return false;
  Result.Line = Row.Line;
  Result.Column = Row.Column;
  Result.Discriminator = Row.Discriminator;
  Result.Source = getSourceByIndex(Row.File, Kind);
  return true;
}